

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O1

Result * validateUpdatableNeuralNetwork<CoreML::Specification::NeuralNetworkClassifier>
                   (Result *__return_storage_ptr__,NeuralNetworkClassifier *nn)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  long lVar3;
  pointer ppLVar4;
  LayerNode *pLVar5;
  pointer pcVar6;
  bool bVar7;
  bool bVar8;
  Type *pTVar9;
  long *plVar10;
  const_iterator cVar11;
  Type *pTVar12;
  undefined1 *puVar13;
  iterator iVar14;
  LayerNode *extraout_RAX;
  LayerNode *pLVar15;
  ulong *puVar16;
  size_type *psVar17;
  long *plVar18;
  int index;
  int iVar19;
  bool bVar20;
  pointer ppLVar21;
  string err_1;
  string layerName;
  string firstNonBackpropogabaleLayerSeen;
  string lossLayerName_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  visitedLayersSet;
  Result r;
  string err_4;
  string err_3;
  string err;
  string currentNodeName;
  vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> layerNodes;
  undefined1 local_2d8 [8];
  _Alloc_hider local_2d0;
  undefined1 local_2c8 [24];
  undefined1 local_2b0 [8];
  _Alloc_hider local_2a8;
  undefined1 local_2a0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  value_type local_268;
  undefined1 local_248 [8];
  undefined1 local_240 [32];
  size_t local_220;
  LayerNode *local_218;
  RepeatedPtrFieldBase *local_210;
  undefined1 local_208 [8];
  undefined1 auStack_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1f0;
  pointer ppLStack_1e0;
  _Base_ptr local_1d8;
  _Alloc_hider _Stack_1d0;
  _Elt_pointer local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  string local_178;
  int local_154;
  key_type local_150;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  undefined1 local_120 [24];
  size_t local_108;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
  local_100;
  string *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_> local_a8;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  CoreML::Result::Result(__return_storage_ptr__);
  CoreML::Result::Result((Result *)local_208);
  index = 0;
  iVar19 = (nn->layers_).super_RepeatedPtrFieldBase.current_size_;
  bVar8 = 0 < iVar19;
  if (iVar19 < 1) {
    bVar20 = false;
  }
  else {
    bVar8 = true;
    bVar20 = false;
    do {
      pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (&(nn->layers_).super_RepeatedPtrFieldBase,index);
      bVar7 = true;
      if (pTVar9->isupdatable_ == true) {
        uVar2 = pTVar9->_oneof_case_[0];
        if (((uVar2 == 100) || (uVar2 == 0x8c)) || (uVar2 == 0x1a4)) {
          validateWeightParamsUpdatable((Result *)local_130,pTVar9);
          local_208 = local_130;
          std::__cxx11::string::operator=((string *)auStack_200,(string *)&local_128);
          if (local_128._M_p != local_120 + 8) {
            operator_delete(local_128._M_p,(ulong)(local_120._8_8_ + 1));
          }
          bVar7 = CoreML::Result::good((Result *)local_208);
          bVar20 = true;
          if (bVar7) {
            bVar7 = true;
            goto LAB_003292d6;
          }
          local_248 = local_208;
          local_240._0_8_ = local_240 + 0x10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)auStack_200._0_8_ == &aStack_1f0) {
            local_240._24_8_ = aStack_1f0._8_8_;
          }
          else {
            local_240._0_8_ = auStack_200._0_8_;
          }
          local_240._16_8_ = aStack_1f0._M_allocated_capacity;
          local_240._8_8_ = auStack_200._8_8_;
          auStack_200._8_8_ = (_Base_ptr)0x0;
          aStack_1f0._M_allocated_capacity = aStack_1f0._M_allocated_capacity & 0xffffffffffffff00;
          auStack_200._0_8_ = &aStack_1f0;
        }
        else {
          local_130 = (undefined1  [8])local_120;
          local_128._M_p = (pointer)0x0;
          local_120._0_8_ = local_120._0_8_ & 0xffffffffffffff00;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b0,"The layer named \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(pTVar9->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          plVar10 = (long *)std::__cxx11::string::append((char *)local_2b0);
          puVar16 = (ulong *)(plVar10 + 2);
          if ((ulong *)*plVar10 == puVar16) {
            local_2c8._0_8_ = *puVar16;
            local_2c8._8_8_ = plVar10[3];
            local_2d8 = (undefined1  [8])local_2c8;
          }
          else {
            local_2c8._0_8_ = *puVar16;
            local_2d8 = (undefined1  [8])*plVar10;
          }
          local_2d0._M_p = (pointer)plVar10[1];
          *plVar10 = (long)puVar16;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_130,(string *)local_2d8);
          if (local_2d8 != (undefined1  [8])local_2c8) {
            operator_delete((void *)local_2d8,(ulong)(local_2c8._0_8_ + 1));
          }
          if (local_2b0 != (undefined1  [8])local_2a0) {
            operator_delete((void *)local_2b0,local_2a0._0_8_ + 1);
          }
          CoreML::Result::Result
                    ((Result *)local_248,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_130);
          if (local_130 != (undefined1  [8])local_120) {
            operator_delete((void *)local_130,(ulong)(local_120._0_8_ + 1));
          }
        }
        bVar20 = true;
        bVar7 = false;
      }
LAB_003292d6:
      if (!bVar7) break;
      index = index + 1;
      iVar19 = (nn->layers_).super_RepeatedPtrFieldBase.current_size_;
      bVar8 = index < iVar19;
    } while (index < iVar19);
  }
  if (!bVar8) {
    if (bVar20) {
      local_240._0_8_ = local_240 + 0x10;
      local_248 = local_208;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_200._0_8_ == &aStack_1f0) {
        local_240._24_8_ = aStack_1f0._8_8_;
      }
      else {
        local_240._0_8_ = auStack_200._0_8_;
      }
      local_240._16_8_ = aStack_1f0._M_allocated_capacity;
      local_240._8_8_ = auStack_200._8_8_;
      auStack_200._8_8_ = (_Base_ptr)0x0;
      aStack_1f0._M_allocated_capacity = aStack_1f0._M_allocated_capacity & 0xffffffffffffff00;
      auStack_200._0_8_ = &aStack_1f0;
    }
    else {
      local_128._M_p = (pointer)0x0;
      local_120._0_8_ = local_120._0_8_ & 0xffffffffffffff00;
      local_130 = (undefined1  [8])local_120;
      std::__cxx11::string::_M_replace((ulong)local_130,0,(char *)0x0,0x3dd38c);
      CoreML::Result::Result
                ((Result *)local_248,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_130);
      if (local_130 != (undefined1  [8])local_120) {
        operator_delete((void *)local_130,(ulong)(local_120._0_8_ + 1));
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_200._0_8_ != &aStack_1f0) {
    operator_delete((void *)auStack_200._0_8_,(ulong)(aStack_1f0._M_allocated_capacity + 1));
  }
  __return_storage_ptr__->m_type = local_248._0_4_;
  __return_storage_ptr__->m_reason = local_248._4_4_;
  local_d0 = (string *)&__return_storage_ptr__->m_message;
  std::__cxx11::string::operator=(local_d0,(string *)local_240);
  if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
    operator_delete((void *)local_240._0_8_,(ulong)(local_240._16_8_ + 1));
  }
  bVar8 = CoreML::Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  CoreML::Result::Result((Result *)local_130);
  aStack_1f0._M_allocated_capacity = (size_type)auStack_200;
  auStack_200._0_8_ = auStack_200._0_8_ & 0xffffffff00000000;
  iVar19 = 0;
  auStack_200._8_8_ = (_Base_ptr)0x0;
  ppLStack_1e0 = (pointer)0x0;
  local_2d8 = (undefined1  [8])local_2c8;
  local_2d0._M_p = (pointer)0x0;
  local_2c8._0_8_ = local_2c8._0_8_ & 0xffffffffffffff00;
  aStack_1f0._8_8_ = aStack_1f0._M_allocated_capacity;
  if (0 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_) {
    do {
      pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (&(nn->layers_).super_RepeatedPtrFieldBase,iVar19);
      plVar10 = (long *)((ulong)(pTVar9->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      local_2b0 = (undefined1  [8])local_2a0;
      lVar3 = *plVar10;
      std::__cxx11::string::_M_construct<char*>((string *)local_2b0,lVar3,plVar10[1] + lVar3);
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_208,(key_type *)local_2b0);
      if (cVar11._M_node == (_Base_ptr)auStack_200) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_208,(key_type *)local_2b0);
      }
      else {
        std::operator+(&local_288,"The updatable model has a name collision for: \'",
                       (key_type *)local_2b0);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_288);
        psVar17 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_268.field_2._M_allocated_capacity = *psVar17;
          local_268.field_2._8_8_ = plVar10[3];
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        }
        else {
          local_268.field_2._M_allocated_capacity = *psVar17;
          local_268._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_268._M_string_length = plVar10[1];
        *plVar10 = (long)psVar17;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_2d8,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        CoreML::Result::Result
                  ((Result *)local_248,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_2d8);
      }
      if (local_2b0 != (undefined1  [8])local_2a0) {
        operator_delete((void *)local_2b0,local_2a0._0_8_ + 1);
      }
      if (cVar11._M_node != (_Base_ptr)auStack_200) goto LAB_00329881;
      iVar19 = iVar19 + 1;
    } while (iVar19 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_);
  }
  local_218 = (LayerNode *)nn->updateparams_;
  if (local_218 == (LayerNode *)0x0) {
    local_218 = (LayerNode *)CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  if (0 < *(int *)&(local_218->children).
                   super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    local_210 = (RepeatedPtrFieldBase *)
                &(local_218->parents).
                 super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
    iVar19 = 0;
    do {
      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                          (local_210,iVar19);
      plVar10 = (long *)((ulong)(pTVar12->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      local_2b0 = (undefined1  [8])local_2a0;
      lVar3 = *plVar10;
      std::__cxx11::string::_M_construct<char*>((string *)local_2b0,lVar3,plVar10[1] + lVar3);
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_208,(key_type *)local_2b0);
      if (cVar11._M_node == (_Base_ptr)auStack_200) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_208,(key_type *)local_2b0);
      }
      else {
        std::operator+(&local_288,"The updatable model has a name collision for: \'",
                       (key_type *)local_2b0);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_288);
        psVar17 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_268.field_2._M_allocated_capacity = *psVar17;
          local_268.field_2._8_8_ = plVar10[3];
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        }
        else {
          local_268.field_2._M_allocated_capacity = *psVar17;
          local_268._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_268._M_string_length = plVar10[1];
        *plVar10 = (long)psVar17;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_2d8,(string *)&local_268);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        CoreML::Result::Result
                  ((Result *)local_248,INVALID_UPDATABLE_MODEL_PARAMETERS,(string *)local_2d8);
      }
      if (local_2b0 != (undefined1  [8])local_2a0) {
        operator_delete((void *)local_2b0,local_2a0._0_8_ + 1);
      }
      if (cVar11._M_node != (_Base_ptr)auStack_200) goto LAB_00329881;
      iVar19 = iVar19 + 1;
    } while (iVar19 < *(int *)&(local_218->children).
                               super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start);
  }
  local_248 = local_130;
  local_240._0_8_ = local_240 + 0x10;
  if (local_128._M_p == local_120 + 8) {
    local_240._24_8_ = local_120._16_8_;
  }
  else {
    local_240._0_8_ = local_128._M_p;
  }
  local_240._16_8_ = local_120._8_8_;
  local_240._8_8_ = local_120._0_8_;
  local_120._0_8_ = (pointer)0x0;
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_128._M_p = local_120 + 8;
LAB_00329881:
  if (local_2d8 != (undefined1  [8])local_2c8) {
    operator_delete((void *)local_2d8,(ulong)(local_2c8._0_8_ + 1));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208);
  if (local_128._M_p != local_120 + 8) {
    operator_delete(local_128._M_p,(ulong)(local_120._8_8_ + 1));
  }
  __return_storage_ptr__->m_type = local_248._0_4_;
  __return_storage_ptr__->m_reason = local_248._4_4_;
  std::__cxx11::string::operator=(local_d0,(string *)local_240);
  if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
    operator_delete((void *)local_240._0_8_,(ulong)(local_240._16_8_ + 1));
  }
  bVar8 = CoreML::Result::good(__return_storage_ptr__);
  if (!bVar8) {
    return __return_storage_ptr__;
  }
  CoreML::Result::Result((Result *)local_2d8);
  puVar13 = (undefined1 *)nn->updateparams_;
  if ((NetworkUpdateParameters *)puVar13 == (NetworkUpdateParameters *)0x0) {
    puVar13 = CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  if (1 < (((NetworkUpdateParameters *)puVar13)->losslayers_).super_RepeatedPtrFieldBase.
          current_size_) {
    auStack_200._0_8_ = (pointer)0x0;
    auStack_200._8_8_ = auStack_200._8_8_ & 0xffffffffffffff00;
    local_208 = (undefined1  [8])(auStack_200 + 8);
    std::__cxx11::string::_M_replace((ulong)local_208,0,(char *)0x0,0x3dd4fa);
    CoreML::Result::Result
              ((Result *)local_2b0,INVALID_UPDATABLE_MODEL_CONFIGURATION,(string *)local_208);
    if (local_208 != (undefined1  [8])(auStack_200 + 8)) {
      operator_delete((void *)local_208,(ulong)(auStack_200._8_8_ + 1));
    }
    goto LAB_0032a3f6;
  }
  local_120._8_8_ = &local_128;
  local_128._M_p = local_128._M_p & 0xffffffff00000000;
  local_120._0_8_ = (pointer)0x0;
  local_108 = 0;
  local_100._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_100._M_impl.super__Rb_tree_header._M_header;
  local_100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_100._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120._16_8_ = local_120._8_8_;
  local_100._M_impl.super__Rb_tree_header._M_header._M_right =
       local_100._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::resize
            (&local_a8,
             (long)(((NetworkUpdateParameters *)puVar13)->losslayers_).super_RepeatedPtrFieldBase.
                   current_size_ + (long)(nn->layers_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_) {
    iVar19 = 0;
    do {
      pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                         (&(nn->layers_).super_RepeatedPtrFieldBase,iVar19);
      CoreML::LayerNode::LayerNode((LayerNode *)local_208,pTVar9);
      std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::
      emplace_back<CoreML::LayerNode>(&local_a8,(LayerNode *)local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_198);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_1d0._M_p != &aStack_1c0) {
        operator_delete(_Stack_1d0._M_p,aStack_1c0._M_allocated_capacity + 1);
      }
      if ((_Alloc_hider *)aStack_1f0._M_allocated_capacity != (_Alloc_hider *)0x0) {
        operator_delete((void *)aStack_1f0._M_allocated_capacity,
                        (long)ppLStack_1e0 - aStack_1f0._0_8_);
      }
      if (local_208 != (undefined1  [8])0x0) {
        operator_delete((void *)local_208,auStack_200._8_8_ - (long)local_208);
      }
      CoreML::NeuralNetworkValidatorGraph::insertNode
                ((NeuralNetworkValidatorGraph *)local_130,
                 local_a8.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1);
      iVar19 = iVar19 + 1;
    } while (iVar19 < (nn->layers_).super_RepeatedPtrFieldBase.current_size_);
  }
  puVar13 = (undefined1 *)nn->updateparams_;
  if ((NetworkUpdateParameters *)puVar13 == (NetworkUpdateParameters *)0x0) {
    puVar13 = CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  if (0 < (((NetworkUpdateParameters *)puVar13)->losslayers_).super_RepeatedPtrFieldBase.
          current_size_) {
    iVar19 = 0;
    do {
      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                          (&(((NetworkUpdateParameters *)puVar13)->losslayers_).
                            super_RepeatedPtrFieldBase,iVar19);
      CoreML::LayerNode::LayerNode((LayerNode *)local_208,pTVar12);
      std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::
      emplace_back<CoreML::LayerNode>(&local_a8,(LayerNode *)local_208);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_198);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_1d0._M_p != &aStack_1c0) {
        operator_delete(_Stack_1d0._M_p,aStack_1c0._M_allocated_capacity + 1);
      }
      if ((_Alloc_hider *)aStack_1f0._M_allocated_capacity != (_Alloc_hider *)0x0) {
        operator_delete((void *)aStack_1f0._M_allocated_capacity,
                        (long)ppLStack_1e0 - aStack_1f0._0_8_);
      }
      if (local_208 != (undefined1  [8])0x0) {
        operator_delete((void *)local_208,auStack_200._8_8_ - (long)local_208);
      }
      CoreML::NeuralNetworkValidatorGraph::insertNode
                ((NeuralNetworkValidatorGraph *)local_130,
                 local_a8.super__Vector_base<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>.
                 _M_impl.super__Vector_impl_data._M_finish + -1);
      validateLossLayer((Result *)local_208,pTVar12,(NeuralNetworkValidatorGraph *)local_130);
      local_2d8 = local_208;
      std::__cxx11::string::operator=((string *)&local_2d0,(string *)auStack_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_200._0_8_ != &aStack_1f0) {
        operator_delete((void *)auStack_200._0_8_,(ulong)(aStack_1f0._M_allocated_capacity + 1));
      }
      bVar8 = CoreML::Result::good((Result *)local_2d8);
      if (!bVar8) goto LAB_0032a37c;
      puVar13 = (undefined1 *)nn->updateparams_;
      if ((NetworkUpdateParameters *)puVar13 == (NetworkUpdateParameters *)0x0) {
        puVar13 = CoreML::Specification::_NetworkUpdateParameters_default_instance_;
      }
      iVar19 = iVar19 + 1;
    } while (iVar19 < (((NetworkUpdateParameters *)puVar13)->losslayers_).super_RepeatedPtrFieldBase
                      .current_size_);
  }
  puVar13 = (undefined1 *)nn->updateparams_;
  if ((NetworkUpdateParameters *)puVar13 == (NetworkUpdateParameters *)0x0) {
    puVar13 = CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  puVar13 = (undefined1 *)((NetworkUpdateParameters *)puVar13)->optimizer_;
  if ((Optimizer *)puVar13 == (Optimizer *)0x0) {
    puVar13 = CoreML::Specification::_Optimizer_default_instance_;
  }
  validateOptimizer((Result *)local_208,(Optimizer *)puVar13);
  local_2d8 = local_208;
  std::__cxx11::string::operator=((string *)&local_2d0,(string *)auStack_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)auStack_200._0_8_ != &aStack_1f0) {
    operator_delete((void *)auStack_200._0_8_,(ulong)(aStack_1f0._M_allocated_capacity + 1));
  }
  bVar8 = CoreML::Result::good((Result *)local_2d8);
  if (bVar8) {
    puVar13 = (undefined1 *)nn->updateparams_;
    if ((NetworkUpdateParameters *)puVar13 == (NetworkUpdateParameters *)0x0) {
      puVar13 = CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    validateOtherTopLevelUpdateParameters((Result *)local_208,(NetworkUpdateParameters *)puVar13);
    local_2d8 = local_208;
    std::__cxx11::string::operator=((string *)&local_2d0,(string *)auStack_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_200._0_8_ != &aStack_1f0) {
      operator_delete((void *)auStack_200._0_8_,(ulong)(aStack_1f0._M_allocated_capacity + 1));
    }
    bVar8 = CoreML::Result::good((Result *)local_2d8);
    if (!bVar8) goto LAB_0032a37c;
    local_240._0_8_ = local_240._0_8_ & 0xffffffff00000000;
    local_240._8_8_ = (_Base_ptr)0x0;
    local_240._16_8_ = local_240;
    local_220 = 0;
    puVar13 = (undefined1 *)nn->updateparams_;
    if ((NetworkUpdateParameters *)puVar13 == (NetworkUpdateParameters *)0x0) {
      puVar13 = CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    local_240._24_8_ = local_240._16_8_;
    if ((((NetworkUpdateParameters *)puVar13)->losslayers_).super_RepeatedPtrFieldBase.current_size_
        < 1) {
LAB_0032a345:
      local_2a8._M_p = local_2a0 + 8;
      local_2b0 = local_2d8;
      if (local_2d0._M_p == local_2c8 + 8) {
        local_2a0._16_8_ = local_2c8._16_8_;
      }
      else {
        local_2a8._M_p = local_2d0._M_p;
      }
      local_2a0._8_8_ = local_2c8._8_8_;
      local_2a0._0_8_ = local_2c8._0_8_;
      local_2c8._0_8_ = (pointer)0x0;
      local_2c8._8_8_ = local_2c8._8_8_ & 0xffffffffffffff00;
      local_2d0._M_p = local_2c8 + 8;
    }
    else {
      paVar1 = &local_150.field_2;
      iVar19 = 0;
      do {
        local_154 = iVar19;
        pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                            (&(((NetworkUpdateParameters *)puVar13)->losslayers_).
                              super_RepeatedPtrFieldBase,iVar19);
        plVar10 = (long *)((ulong)(pTVar12->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
        lVar3 = *plVar10;
        std::__cxx11::string::_M_construct<char*>((string *)&local_268,lVar3,plVar10[1] + lVar3);
        local_1c8 = (_Elt_pointer)0x0;
        aStack_1c0._M_allocated_capacity = 0;
        local_1d8 = (_Base_ptr)0x0;
        _Stack_1d0._M_p = (pointer)0x0;
        aStack_1f0._8_8_ = (_Alloc_hider *)0x0;
        ppLStack_1e0 = (pointer)0x0;
        auStack_200._8_8_ = (_Base_ptr)0x0;
        aStack_1f0._M_allocated_capacity = 0;
        local_208 = (undefined1  [8])0x0;
        auStack_200._0_8_ = (pointer)0x0;
        std::
        _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_208,0);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_208,&local_268);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        local_288._M_string_length = 0;
        local_288.field_2._M_local_buf[0] = '\0';
        local_210 = (RepeatedPtrFieldBase *)((ulong)local_210 & 0xffffffff00000000);
        do {
          if (local_1d8 == (_Base_ptr)auStack_200._8_8_) {
            iVar19 = 0;
            break;
          }
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,*(long *)auStack_200._8_8_,
                     (long)&(*(_Base_ptr *)(auStack_200._8_8_ + 8))->_M_color +
                     *(long *)auStack_200._8_8_);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_208);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,local_c8._M_dataplus._M_p,
                     local_c8._M_dataplus._M_p + local_c8._M_string_length);
          local_218 = CoreML::NeuralNetworkValidatorGraph::getNodeFromName
                                ((NeuralNetworkValidatorGraph *)local_130,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if (local_218 == (LayerNode *)0x0) {
            std::operator+(&local_178,"Failed to look up node for \'",&local_c8);
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_178);
            psVar17 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_150.field_2._M_allocated_capacity = *psVar17;
              local_150.field_2._8_8_ = plVar10[3];
              local_150._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_150.field_2._M_allocated_capacity = *psVar17;
              local_150._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_150._M_string_length = plVar10[1];
            *plVar10 = (long)psVar17;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,
                              CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                       local_178.field_2._M_local_buf[0]) + 1);
            }
            CoreML::Result::Result
                      ((Result *)local_2b0,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_150);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != paVar1) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            iVar19 = 1;
          }
          else {
            ppLVar21 = (local_218->parents).
                       super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppLVar4 = (local_218->parents).
                      super__Vector_base<CoreML::LayerNode_*,_std::allocator<CoreML::LayerNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            iVar19 = 0xd;
            if (ppLVar21 != ppLVar4) {
              do {
                pLVar5 = *ppLVar21;
                pcVar6 = (pLVar5->name)._M_dataplus._M_p;
                local_150._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_150,pcVar6,pcVar6 + (pLVar5->name)._M_string_length);
                iVar14 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_248,&local_150);
                iVar19 = 0xe;
                if (iVar14._M_node == (_Base_ptr)local_240) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_248,&local_150);
                  std::
                  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_208,&local_150);
                  if ((pLVar5->isUpdatable == true) && (((ulong)local_210 & 1) != 0)) {
                    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
                    local_178._M_string_length = 0;
                    local_178.field_2._M_local_buf[0] = '\0';
                    std::operator+(&local_50,"There is a layer (",&local_288);
                    plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
                    plVar18 = plVar10 + 2;
                    if ((long *)*plVar10 == plVar18) {
                      local_80 = *plVar18;
                      lStack_78 = plVar10[3];
                      local_90 = &local_80;
                    }
                    else {
                      local_80 = *plVar18;
                      local_90 = (long *)*plVar10;
                    }
                    local_88 = plVar10[1];
                    *plVar10 = (long)plVar18;
                    plVar10[1] = 0;
                    *(undefined1 *)(plVar10 + 2) = 0;
                    std::__cxx11::string::operator=((string *)&local_178,(string *)&local_90);
                    if (local_90 != &local_80) {
                      operator_delete(local_90,local_80 + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_50._M_dataplus._M_p != &local_50.field_2) {
                      operator_delete(local_50._M_dataplus._M_p,
                                      local_50.field_2._M_allocated_capacity + 1);
                    }
                    CoreML::Result::Result
                              ((Result *)local_2b0,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_178)
                    ;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_178._M_dataplus._M_p != &local_178.field_2) {
                      operator_delete(local_178._M_dataplus._M_p,
                                      CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                                               local_178.field_2._M_local_buf[0]) + 1);
                    }
                    iVar19 = 1;
                  }
                  else if (pLVar5->isBackPropagable == false) {
                    pLVar15 = extraout_RAX;
                    if ((pLVar5->layerType != kSoftmax) ||
                       (pLVar15 = local_218,
                       local_218->lossLayerType != kCategoricalCrossEntropyLossLayer)) {
                      local_210 = (RepeatedPtrFieldBase *)
                                  CONCAT44(local_210._4_4_,
                                           (int)CONCAT71((int7)((ulong)pLVar15 >> 8),1));
                      std::__cxx11::string::_M_assign((string *)&local_288);
                      iVar19 = 0;
                    }
                  }
                  else {
                    iVar19 = 0;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p != paVar1) {
                  operator_delete(local_150._M_dataplus._M_p,
                                  local_150.field_2._M_allocated_capacity + 1);
                }
                if ((iVar19 != 0xe) && (iVar19 != 0)) goto LAB_0032a278;
                ppLVar21 = ppLVar21 + 1;
              } while (ppLVar21 != ppLVar4);
              iVar19 = 0xd;
            }
LAB_0032a278:
            if (iVar19 == 0xd) {
              iVar19 = 0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        } while (iVar19 == 0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
        }
        if (iVar19 != 0) goto LAB_0032a33c;
        puVar13 = (undefined1 *)nn->updateparams_;
        if ((NetworkUpdateParameters *)puVar13 == (NetworkUpdateParameters *)0x0) {
          puVar13 = CoreML::Specification::_NetworkUpdateParameters_default_instance_;
        }
        iVar19 = local_154 + 1;
      } while (iVar19 < (((NetworkUpdateParameters *)puVar13)->losslayers_).
                        super_RepeatedPtrFieldBase.current_size_);
      iVar19 = 8;
LAB_0032a33c:
      if (iVar19 == 8) goto LAB_0032a345;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_248);
  }
  else {
LAB_0032a37c:
    local_2a8._M_p = local_2a0 + 8;
    local_2b0 = local_2d8;
    if (local_2d0._M_p == local_2c8 + 8) {
      local_2a0._16_8_ = local_2c8._16_8_;
    }
    else {
      local_2a8._M_p = local_2d0._M_p;
    }
    local_2a0._8_8_ = local_2c8._8_8_;
    local_2a0._0_8_ = local_2c8._0_8_;
    local_2c8._0_8_ = (pointer)0x0;
    local_2c8._8_8_ = local_2c8._8_8_ & 0xffffffffffffff00;
    local_2d0._M_p = local_2c8 + 8;
  }
  std::vector<CoreML::LayerNode,_std::allocator<CoreML::LayerNode>_>::~vector(&local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
  ::~_Rb_tree(&local_100);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::LayerNode_*>_>_>
               *)local_130);
LAB_0032a3f6:
  if (local_2d0._M_p != local_2c8 + 8) {
    operator_delete(local_2d0._M_p,local_2c8._8_8_ + 1);
  }
  __return_storage_ptr__->m_type = local_2b0._0_4_;
  __return_storage_ptr__->m_reason = local_2b0._4_4_;
  std::__cxx11::string::operator=(local_d0,(string *)&local_2a8);
  if (local_2a8._M_p != local_2a0 + 8) {
    operator_delete(local_2a8._M_p,local_2a0._8_8_ + 1);
  }
  CoreML::Result::good(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result validateUpdatableNeuralNetwork(const T& nn) {
    
    Result r;

    r = validateUpdatableLayerSupport(nn);
    if (!r.good()) {return r;}
    
    r = validateLayerAndLossLayerNamesCollisions(nn);
    if (!r.good()) {return r;}

    r = isTrainingConfigurationSupported(nn);
    if (!r.good()) {return r;}
    
    return r;
}